

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void mg_stop(mg_context *ctx)

{
  pthread_t threadid;
  pthread_t mt;
  mg_context *ctx_local;
  
  if ((ctx != (mg_context *)0x0) && (threadid = ctx->masterthreadid, threadid != 0)) {
    ctx->masterthreadid = 0;
    ctx->stop_flag = 1;
    while (ctx->stop_flag != 2) {
      usleep(10000);
    }
    mg_join_thread(threadid);
    free_context(ctx);
  }
  return;
}

Assistant:

CIVETWEB_API void
mg_stop(struct mg_context *ctx)
{
	pthread_t mt;
	if (!ctx) {
		return;
	}

	/* We don't use a lock here. Calling mg_stop with the same ctx from
	 * two threads is not allowed. */
	mt = ctx->masterthreadid;
	if (mt == 0) {
		return;
	}

	ctx->masterthreadid = 0;

	/* Set stop flag, so all threads know they have to exit. */
	STOP_FLAG_ASSIGN(&ctx->stop_flag, 1);

	/* Join timer thread */
#if defined(USE_TIMERS)
	timers_exit(ctx);
#endif

	/* Wait until everything has stopped. */
	while (!STOP_FLAG_IS_TWO(&ctx->stop_flag)) {
		(void)mg_sleep(10);
	}

	/* Wait to stop master thread */
	mg_join_thread(mt);

	/* Close remaining Lua states */
#if defined(USE_LUA)
	lua_ctx_exit(ctx);
#endif

	/* Free memory */
	free_context(ctx);
}